

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::ModifyMaximalReconvergence::Process(ModifyMaximalReconvergence *this)

{
  bool bVar1;
  
  if ((this->super_Pass).field_0x31 == '\x01') {
    bVar1 = AddMaximalReconvergence(this);
  }
  else {
    bVar1 = RemoveMaximalReconvergence(this);
  }
  return bVar1 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status ModifyMaximalReconvergence::Process() {
  bool changed = false;
  if (add_) {
    changed = AddMaximalReconvergence();
  } else {
    changed = RemoveMaximalReconvergence();
  }
  return changed ? Pass::Status::SuccessWithChange
                 : Pass::Status::SuccessWithoutChange;
}